

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractDOMParser::setExternalSchemaLocation
          (AbstractDOMParser *this,XMLCh *schemaLocation)

{
  XMLScanner::setExternalSchemaLocation(this->fScanner,schemaLocation);
  return;
}

Assistant:

void AbstractDOMParser::setExternalSchemaLocation(const XMLCh* const schemaLocation)
{
    fScanner->setExternalSchemaLocation(schemaLocation);
}